

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O0

void __thiscall
TI::TMS::SMSFetcher<(TI::TMS::Personality)4>::SMSFetcher
          (SMSFetcher<(TI::TMS::Personality)4> *this,Base<(TI::TMS::Personality)4> *base,uint8_t y)

{
  ushort uVar1;
  AddressT AVar2;
  short sVar3;
  unsigned_short uVar4;
  int iVar5;
  ushort uVar6;
  uint uVar7;
  bool bVar8;
  int local_3c;
  int scrolled_row;
  AddressT pattern_name_offset;
  AddressT pattern_name_address;
  bool is_tall_mode;
  uint8_t y_local;
  Base<(TI::TMS::Personality)4> *base_local;
  SMSFetcher<(TI::TMS::Personality)4> *this_local;
  
  this->base = base;
  this->storage = &base->super_Storage<(TI::TMS::Personality)4,_void>;
  this->y = y;
  if ((y < 0x10) && ((this->storage->horizontal_scroll_lock_ & 1U) != 0)) {
    local_3c = 0;
  }
  else {
    local_3c = (int)(uint)base->fetch_line_buffer_->latched_horizontal_scroll >> 3;
  }
  this->horizontal_offset = local_3c;
  bVar8 = (base->mode_timing_).pixel_lines != 0xc0;
  uVar1 = this->storage->pattern_name_address_;
  uVar6 = 0;
  if (bVar8) {
    uVar6 = 0x800;
  }
  sVar3 = 0;
  if (bVar8) {
    sVar3 = 0x100;
  }
  iVar5 = 0xe0;
  if (bVar8) {
    iVar5 = 0x100;
  }
  uVar7 = (uint)((ulong)((uint)y + (uint)this->storage->latched_vertical_scroll_) %
                (ulong)(long)iVar5);
  uVar4 = bits<11,unsigned_short>((unsigned_short)((uVar7 & 0xfffffff8) << 3));
  (this->scrolled_row_info).pattern_address_base = ((uVar1 | uVar6) & uVar4) - sVar3;
  (this->scrolled_row_info).sub_row[0] = (AddressT)((uVar7 & 7) << 2);
  (this->scrolled_row_info).sub_row[1] = (ushort)((uVar7 & 7) << 2) ^ 0x1c;
  if ((this->storage->vertical_scroll_lock_ & 1U) == 0) {
    AVar2 = (this->scrolled_row_info).sub_row[0];
    (this->static_row_info).pattern_address_base = (this->scrolled_row_info).pattern_address_base;
    (this->static_row_info).sub_row[0] = AVar2;
    (this->static_row_info).sub_row[1] = (this->scrolled_row_info).sub_row[1];
  }
  else {
    uVar4 = bits<11,unsigned_short>(uVar1 & (y & 0xfff8) << 3);
    (this->static_row_info).pattern_address_base = uVar4 - sVar3;
    (this->static_row_info).sub_row[0] = (y & 7) << 2;
    (this->static_row_info).sub_row[1] = (y & 7) << 2 ^ 0x1c;
  }
  return;
}

Assistant:

SMSFetcher(Base<personality> *base, uint8_t y) :
		base(base),
		storage(static_cast<Storage<personality> *>(base)),
		y(y),
		horizontal_offset((y >= 16 || !storage->horizontal_scroll_lock_) ? (base->fetch_line_buffer_->latched_horizontal_scroll >> 3) : 0)
	{
		// Limit address bits in use if this is a SMS2 mode.
		const bool is_tall_mode = base->mode_timing_.pixel_lines != 192;
		const AddressT pattern_name_address = storage->pattern_name_address_ | (is_tall_mode ? 0x800 : 0);
		const AddressT pattern_name_offset = is_tall_mode ? 0x100 : 0;

		// Determine row info for the screen both (i) if vertical scrolling is applied; and (ii) if it isn't.
		// The programmer can opt out of applying vertical scrolling to the right-hand portion of the display.
		const int scrolled_row = (y + storage->latched_vertical_scroll_) % (is_tall_mode ? 256 : 224);
		scrolled_row_info.pattern_address_base = (pattern_name_address & bits<11>(AddressT((scrolled_row & ~7) << 3))) - pattern_name_offset;
		scrolled_row_info.sub_row[0] = AddressT((scrolled_row & 7) << 2);
		scrolled_row_info.sub_row[1] = AddressT(28 ^ ((scrolled_row & 7) << 2));
		if(storage->vertical_scroll_lock_) {
			static_row_info.pattern_address_base = bits<11>(AddressT(pattern_name_address & ((y & ~7) << 3))) - pattern_name_offset;
			static_row_info.sub_row[0] = AddressT((y & 7) << 2);
			static_row_info.sub_row[1] = 28 ^ AddressT((y & 7) << 2);
		} else static_row_info = scrolled_row_info;
	}